

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concavity.cpp
# Opt level: O1

float __thiscall
ConvexDecomposition::CTri::raySect(CTri *this,Vector3d *p,Vector3d *dir,Vector3d *sect)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float x;
  float y;
  float z;
  
  fVar6 = (this->mNormal).y;
  fVar1 = this->mPlaneD;
  fVar2 = p->x;
  fVar3 = p->y;
  fVar4 = p->z;
  auVar7 = ZEXT416((uint)(this->mNormal).x);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar6)),ZEXT416((uint)fVar2),auVar7);
  auVar9 = ZEXT416((uint)(this->mNormal).z);
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar4),auVar9);
  fVar3 = (fVar3 + dir->y * 100000.0) - fVar3;
  auVar11 = ZEXT416((uint)((dir->x * 100000.0 + fVar2) - fVar2));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar3)),auVar11,auVar7);
  auVar10 = ZEXT416((uint)((fVar4 + dir->z * 100000.0) - fVar4));
  auVar7 = vfmadd231ss_fma(auVar7,auVar10,auVar9);
  auVar9._8_4_ = 0x80000000;
  auVar9._0_8_ = 0x8000000080000000;
  auVar9._12_4_ = 0x80000000;
  auVar5 = vxorps_avx512vl(ZEXT416((uint)(fVar1 + ((auVar5._0_4_ + fVar1) - fVar1))),auVar9);
  auVar8._0_4_ = auVar5._0_4_ / auVar7._0_4_;
  auVar8._4_12_ = auVar5._4_12_;
  auVar5 = vfmadd213ss_fma(auVar11,auVar8,ZEXT416((uint)fVar2));
  sect->x = auVar5._0_4_;
  auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar8,ZEXT416((uint)p->y));
  sect->y = auVar7._0_4_;
  auVar9 = vfmadd213ss_fma(auVar8,auVar10,ZEXT416((uint)p->z));
  sect->z = auVar9._0_4_;
  fVar6 = p->y - auVar7._0_4_;
  auVar5 = ZEXT416((uint)(p->x - auVar5._0_4_));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),auVar5,auVar5);
  auVar7 = ZEXT416((uint)(p->z - auVar9._0_4_));
  auVar5 = vfmadd231ss_fma(auVar5,auVar7,auVar7);
  if (0.0 <= auVar5._0_4_) {
    auVar5 = vsqrtss_avx(auVar5,auVar5);
    return auVar5._0_4_;
  }
  fVar6 = sqrtf(auVar5._0_4_);
  return fVar6;
}

Assistant:

float raySect(const Vector3d &p,const Vector3d &dir,Vector3d &sect) const
	{
		float plane[4];

    plane[0] = mNormal.x;
    plane[1] = mNormal.y;
    plane[2] = mNormal.z;
    plane[3] = mPlaneD;

		Vector3d dest = p+dir*100000;

    intersect( p.Ptr(), dest.Ptr(), sect.Ptr(), plane );

    return sect.Distance(p); // return the intersection distance.

	}